

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O2

void __thiscall
tcmalloc::ThreadCache::ReleaseToCentralCache(ThreadCache *this,FreeList *src,uint32_t cl,int N)

{
  ulong uVar1;
  int iVar2;
  uint N_00;
  void *local_48;
  void *tail;
  void *head;
  
  if ((ulong)src->length_ < (ulong)(long)N) {
    N = src->length_;
  }
  uVar1 = (ulong)cl;
  iVar2 = *(int *)(&DAT_00158304 + uVar1 * 4);
  head._4_4_ = (&DAT_00158504)[uVar1];
  N_00 = N;
  while( true ) {
    if (N_00 - iVar2 == 0 || (int)N_00 < iVar2) break;
    FreeList::PopRange(src,iVar2,&tail,&local_48);
    CentralFreeList::InsertRange
              ((CentralFreeList *)(Static::central_cache_ + uVar1 * 0x4c0),tail,local_48,iVar2);
    N_00 = N_00 - iVar2;
  }
  iVar2 = N * head._4_4_;
  FreeList::PopRange(src,N_00,&tail,&local_48);
  CentralFreeList::InsertRange
            ((CentralFreeList *)(Static::central_cache_ + uVar1 * 0x4c0),tail,local_48,N_00);
  this->size_ = this->size_ - iVar2;
  return;
}

Assistant:

void ThreadCache::ReleaseToCentralCache(FreeList* src, uint32_t cl, int N) {
  ASSERT(src == &list_[cl]);
  if (N > src->length()) N = src->length();
  size_t delta_bytes = N * Static::sizemap()->ByteSizeForClass(cl);

  // We return prepackaged chains of the correct size to the central cache.
  // TODO: Use the same format internally in the thread caches?
  int batch_size = Static::sizemap()->num_objects_to_move(cl);
  while (N > batch_size) {
    void *tail, *head;
    src->PopRange(batch_size, &head, &tail);
    Static::central_cache()[cl].InsertRange(head, tail, batch_size);
    N -= batch_size;
  }
  void *tail, *head;
  src->PopRange(N, &head, &tail);
  Static::central_cache()[cl].InsertRange(head, tail, N);
  size_ -= delta_bytes;
}